

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinTree.h
# Opt level: O0

BinSTree<int> * __thiscall BinTrees::BinSTree<int>::search(BinSTree<int> *this,int *v)

{
  BinTree<int> **ppBVar1;
  runtime_error *prVar2;
  BinSTree<int> *in_RSI;
  BinTree<int> *in_RDI;
  int *in_stack_ffffffffffffffe0;
  BinTree<int> *local_8;
  
  if ((in_RSI->super_BinTree<int>).v < in_RDI->v) {
    ppBVar1 = BinTree<int>::L(in_RDI);
    if (*ppBVar1 == (BinTree<int> *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Not found");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    BinTree<int>::L(in_RDI);
    local_8 = &search(in_RSI,in_stack_ffffffffffffffe0)->super_BinTree<int>;
  }
  else {
    local_8 = in_RDI;
    if (in_RDI->v != (in_RSI->super_BinTree<int>).v) {
      ppBVar1 = BinTree<int>::R(in_RDI);
      if (*ppBVar1 == (BinTree<int> *)0x0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Not found");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      BinTree<int>::R(in_RDI);
      local_8 = &search(in_RSI,in_stack_ffffffffffffffe0)->super_BinTree<int>;
    }
  }
  return (BinSTree<int> *)local_8;
}

Assistant:

const BinSTree<T> &BinSTree<T>::search(const T &v) const {
        if (this->v > v) {
            if (this->L() == nullptr) throw std::runtime_error("Not found");
            return static_cast<BinSTree<T> *>(this->L())->search(v);
        } else if (this->v == v) return *this;
        else {
            if (this->R() == nullptr) throw std::runtime_error("Not found");
            return static_cast<BinSTree<T> *>(this->R())->search(v);
        }
    }